

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O3

Pos_index __thiscall
Gudhi::persistence_matrix::
Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
::birth(Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
        *this,ID_index pivot)

{
  const_iterator cVar1;
  Pos_index simplexIndex;
  Pos_index local_c;
  
  local_c = _get_pivot_position(this,pivot);
  cVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->
                  super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
                  ).indexToBar_._M_h,&local_c);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    return *(Pos_index *)
            (*(long *)((long)cVar1.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_false>
                             ._M_cur + 0x10) + 0x14);
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

Pos_index birth(ID_index pivot) const {
    Pos_index simplexIndex = _get_pivot_position(pivot);

    if constexpr (Master_matrix::Option_list::has_removable_columns) {
      return CP::indexToBar_.at(simplexIndex)->birth;
    } else {
      return CP::barcode_.at(CP::indexToBar_.at(simplexIndex)).birth;
    }
  }